

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  string *__return_storage_ptr__;
  bool bVar1;
  int line;
  uint uVar2;
  ostream *poVar3;
  XmlUnitTestResultPrinter *pXVar4;
  char *pcVar5;
  internal *piVar6;
  TestPartResult *this;
  char *data;
  char *str;
  char *str_00;
  char *str_01;
  TimeInMillis ms;
  char *str_02;
  TestResult *result_00;
  undefined1 auVar7 [16];
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  string detail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  string summary;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  TestResult *local_28;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_case_name_local;
  ostream *stream_local;
  
  result = (TestResult *)test_info;
  test_info_local = (TestInfo *)test_case_name;
  test_case_name_local = (char *)stream;
  local_28 = TestInfo::result(test_info);
  poVar3 = std::operator<<((ostream *)test_case_name_local,"    <testcase name=\"");
  pXVar4 = (XmlUnitTestResultPrinter *)TestInfo::name((TestInfo *)result);
  EscapeXmlAttribute_abi_cxx11_(&local_48,pXVar4,str);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::operator<<(poVar3,"\"");
  std::__cxx11::string::~string((string *)&local_48);
  pcVar5 = TestInfo::value_param((TestInfo *)result);
  if (pcVar5 != (char *)0x0) {
    poVar3 = std::operator<<((ostream *)test_case_name_local," value_param=\"");
    pXVar4 = (XmlUnitTestResultPrinter *)TestInfo::value_param((TestInfo *)result);
    EscapeXmlAttribute_abi_cxx11_(&local_78,pXVar4,str_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    std::operator<<(poVar3,"\"");
    std::__cxx11::string::~string((string *)&local_78);
  }
  pcVar5 = TestInfo::type_param((TestInfo *)result);
  if (pcVar5 != (char *)0x0) {
    poVar3 = std::operator<<((ostream *)test_case_name_local," type_param=\"");
    pXVar4 = (XmlUnitTestResultPrinter *)TestInfo::type_param((TestInfo *)result);
    EscapeXmlAttribute_abi_cxx11_(&local_98,pXVar4,str_01);
    poVar3 = std::operator<<(poVar3,(string *)&local_98);
    std::operator<<(poVar3,"\"");
    std::__cxx11::string::~string((string *)&local_98);
  }
  poVar3 = std::operator<<((ostream *)test_case_name_local," status=\"");
  bVar1 = TestInfo::should_run((TestInfo *)result);
  pcVar5 = "notrun";
  if (bVar1) {
    pcVar5 = "run";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3,"\" time=\"");
  piVar6 = (internal *)TestResult::elapsed_time(local_28);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_b8,piVar6,ms);
  poVar3 = std::operator<<(poVar3,(string *)&local_b8);
  poVar3 = std::operator<<(poVar3,"\" classname=\"");
  EscapeXmlAttribute_abi_cxx11_(&local_d8,(XmlUnitTestResultPrinter *)test_info_local,str_02);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3,"\"");
  TestPropertiesAsXmlAttributes_abi_cxx11_
            ((string *)&i,(XmlUnitTestResultPrinter *)local_28,result_00);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::operator<<(poVar3,pcVar5);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  part._4_4_ = 0;
  for (part._0_4_ = 0; line = TestResult::total_part_count(local_28), (int)part < line;
      part._0_4_ = (int)part + 1) {
    this = TestResult::GetTestPartResult(local_28,(int)part);
    bVar1 = TestPartResult::failed(this);
    if (bVar1) {
      part._4_4_ = part._4_4_ + 1;
      if (part._4_4_ == 1) {
        std::operator<<((ostream *)test_case_name_local,">\n");
      }
      piVar6 = (internal *)TestPartResult::file_name(this);
      uVar2 = TestPartResult::line_number(this);
      __return_storage_ptr__ = (string *)((long)&summary.field_2 + 8);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (__return_storage_ptr__,piVar6,(char *)(ulong)uVar2,line);
      std::operator+(&local_168,__return_storage_ptr__,"\n");
      pcVar5 = TestPartResult::summary(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     &local_168,pcVar5);
      std::__cxx11::string::~string((string *)&local_168);
      poVar3 = std::operator<<((ostream *)test_case_name_local,"      <failure message=\"");
      auVar7 = std::__cxx11::string::c_str();
      EscapeXmlAttribute_abi_cxx11_((string *)((long)&detail.field_2 + 8),auVar7._0_8_,auVar7._8_8_)
      ;
      poVar3 = std::operator<<(poVar3,(string *)(detail.field_2._M_local_buf + 8));
      std::operator<<(poVar3,"\" type=\"\">");
      std::__cxx11::string::~string((string *)(detail.field_2._M_local_buf + 8));
      std::operator+(&local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&summary.field_2 + 8),"\n");
      pcVar5 = TestPartResult::message(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     &local_1c8,pcVar5);
      std::__cxx11::string::~string((string *)&local_1c8);
      pcVar5 = test_case_name_local;
      RemoveInvalidXmlCharacters(&local_1e8,(string *)local_1a8);
      data = (char *)std::__cxx11::string::c_str();
      OutputXmlCDataSection((ostream *)pcVar5,data);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::operator<<((ostream *)test_case_name_local,"</failure>\n");
      std::__cxx11::string::~string((string *)local_1a8);
      std::__cxx11::string::~string((string *)local_148);
      std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
    }
  }
  if (part._4_4_ == 0) {
    std::operator<<((ostream *)test_case_name_local," />\n");
  }
  else {
    std::operator<<((ostream *)test_case_name_local,"    </testcase>\n");
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str() << "\"";

  if (test_info.value_param() != NULL) {
    *stream << " value_param=\"" << EscapeXmlAttribute(test_info.value_param())
            << "\"";
  }
  if (test_info.type_param() != NULL) {
    *stream << " type_param=\"" << EscapeXmlAttribute(test_info.type_param())
            << "\"";
  }

  *stream << " status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}